

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnEnd(TypeChecker *this)

{
  LabelType LVar1;
  Result RVar2;
  Label *in_RAX;
  Enum EVar3;
  Label *local_28;
  Label *label;
  
  local_28 = in_RAX;
  RVar2 = GetLabel(this,0,&local_28);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    LVar1 = local_28->label_type;
    if (8 < (int)LVar1) {
      __assert_fail("static_cast<int>(label->label_type) < kLabelTypeCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/type-checker.cc"
                    ,0x212,"Result wabt::TypeChecker::OnEnd()");
    }
    if (((LVar1 == IfExcept) || (LVar1 == If)) && (RVar2 = OnElse(this), RVar2.enum_ == Error)) {
      return (Result)Error;
    }
    RVar2 = OnEnd(this,local_28,OnEnd::s_label_type_name[(int)local_28->label_type],
                  OnEnd::s_label_type_name[(int)local_28->label_type]);
    EVar3 = (Enum)(RVar2.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::OnEnd() {
  Result result = Result::Ok;
  static const char* s_label_type_name[] = {"function",
                                            "block",
                                            "loop",
                                            "if",
                                            "if false branch",
                                            "if_except",
                                            "if_except false branch",
                                            "try",
                                            "try catch"};
  WABT_STATIC_ASSERT(WABT_ARRAY_SIZE(s_label_type_name) == kLabelTypeCount);
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  assert(static_cast<int>(label->label_type) < kLabelTypeCount);
  if (label->label_type == LabelType::If ||
      label->label_type == LabelType::IfExcept) {
    // An if without an else will just pass the params through, so the result
    // types must be the same as the param types. It has the same behavior as
    // an empty else block.
    CHECK_RESULT(OnElse());
  }
  const char* desc = s_label_type_name[static_cast<int>(label->label_type)];
  result |= OnEnd(label, desc, desc);
  return result;
}